

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O2

int __thiscall QuadList<SSTableDataEntry>::init(QuadList<SSTableDataEntry> *this,EVP_PKEY_CTX *ctx)

{
  QuadListNode<SSTableDataEntry> *pQVar1;
  NodePosi pQVar2;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [32];
  _Alloc_hider local_38;
  size_type sStack_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  pQVar2 = (NodePosi)operator_new(0x60);
  local_38._M_p = (pointer)&local_28;
  sStack_30 = 0;
  local_28._8_8_ = 0;
  local_58._0_8_ = 0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_28._M_allocated_capacity = 0;
  SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)pQVar2,(SSTableDataEntry *)local_58);
  pQVar2->above = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->below = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->pred = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->succ = (QuadListNode<SSTableDataEntry> *)0x0;
  this->header = pQVar2;
  std::__cxx11::string::~string((string *)&local_38);
  pQVar2 = (NodePosi)operator_new(0x60);
  local_78._M_p = (pointer)&local_68;
  sStack_70 = 0;
  local_68._8_8_ = 0;
  local_98._0_8_ = 0;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  local_98._24_8_ = 0;
  local_68._M_allocated_capacity = 0;
  SSTableDataEntry::SSTableDataEntry((SSTableDataEntry *)pQVar2,(SSTableDataEntry *)local_98);
  pQVar2->above = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->below = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->pred = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->succ = (QuadListNode<SSTableDataEntry> *)0x0;
  this->trailer = pQVar2;
  std::__cxx11::string::~string((string *)&local_78);
  pQVar2 = this->header;
  pQVar1 = this->trailer;
  pQVar2->succ = pQVar1;
  pQVar1->pred = pQVar2;
  return (int)pQVar2;
}

Assistant:

void QuadList<T>::init() {
    header = new Node();
    trailer = new Node();
    header->succ = trailer;
    trailer->pred = header;
}